

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

bool __thiscall QMenu::isEmpty(QMenu *this)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  int i;
  ulong uVar4;
  long in_FS_OFFSET;
  QList<QAction_*> local_68;
  QList<QAction_*> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = true;
  uVar4 = 0;
  while( true ) {
    if (bVar3) {
      QWidget::actions(&local_50,&this->super_QWidget);
      bVar1 = uVar4 < (ulong)local_50.d.size;
    }
    else {
      bVar1 = false;
    }
    if ((bVar3 != false) && (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0)) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,8,0x10);
      }
    }
    if (!bVar1) break;
    QWidget::actions(&local_68,&this->super_QWidget);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,8,0x10);
      }
    }
    cVar2 = QAction::isSeparator();
    if (cVar2 == '\0') {
      cVar2 = QAction::isVisible();
      if (cVar2 != '\0') {
        bVar3 = false;
      }
    }
    uVar4 = uVar4 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QMenu::isEmpty() const
{
    bool ret = true;
    for(int i = 0; ret && i < actions().size(); ++i) {
        const QAction *action = actions().at(i);
        if (!action->isSeparator() && action->isVisible()) {
            ret = false;
        }
    }
    return ret;
}